

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deorbitalize_func.c
# Opt level: O3

void xc_mgga_evaluate_functional
               (xc_func_type *func,size_t np,double *rho,double *sigma,undefined8 param_5,
               undefined8 param_6,double *zk,double *vrho,double *vsigma,undefined8 vlapl,
               undefined8 vtau,double *v2rho2,double *v2rhosigma,undefined8 v2rholapl,
               undefined8 v2rhotau,double *v2sigma2)

{
  int iVar1;
  double *v3rho3;
  double *v3rho2sigma;
  double *v3rhosigma2;
  double *v3sigma3;
  double *v4rho4;
  double *v4rho3sigma;
  double *v4rho2sigma2;
  double *v4rhosigma3;
  double *v4sigma4;
  
  if ((func->info->flags & 1) == 0) {
    zk = (double *)0x0;
  }
  iVar1 = func->info->family;
  if (iVar1 < 0x20) {
    if (iVar1 == 1) {
LAB_00eee7ce:
      xc_lda(func,np,rho,zk,vrho,v2rho2,v3rho3,v4rho4);
      return;
    }
    if (iVar1 != 2) {
      if (iVar1 != 4) {
        return;
      }
LAB_00eee843:
      xc_mgga();
      return;
    }
  }
  else if (iVar1 != 0x20) {
    if (iVar1 == 0x40) goto LAB_00eee843;
    if (iVar1 != 0x80) {
      return;
    }
    goto LAB_00eee7ce;
  }
  xc_gga(func,np,rho,sigma,zk,vrho,vsigma,v2rho2,v2rhosigma,v2sigma2,v3rho3,v3rho2sigma,v3rhosigma2,
         v3sigma3,v4rho4,v4rho3sigma,v4rho2sigma2,v4rhosigma3,v4sigma4);
  return;
}

Assistant:

void
xc_mgga_evaluate_functional(const xc_func_type *func, size_t np,
                            const double *rho, const double *sigma, const double *lapl, const double *tau,
                            double *zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double *, ))
{
  double *mzk = NULL;

  if(func->info->flags & XC_FLAGS_HAVE_EXC)
    mzk = zk;
  
  /* Evaluate the functional */
  switch(func->info->family){
  case XC_FAMILY_LDA:
  case XC_FAMILY_HYB_LDA:
    xc_lda(func, np, rho,
           mzk LDA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  case XC_FAMILY_GGA:
  case XC_FAMILY_HYB_GGA:
    xc_gga(func, np, rho, sigma,
           mzk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  case XC_FAMILY_MGGA:
  case XC_FAMILY_HYB_MGGA:
    xc_mgga(func, np, rho, sigma, lapl, tau,
            mzk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));
    break;
  }
}